

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.c
# Opt level: O0

void lexicon_free(lexicon_t *lexicon)

{
  lex_entry_t *entry;
  hash_iter_t *itor;
  lexicon_t *lexicon_local;
  
  for (entry = (lex_entry_t *)hash_table_iter(lexicon->ht); entry != (lex_entry_t *)0x0;
      entry = (lex_entry_t *)hash_table_iter_next((hash_iter_t *)entry)) {
    lexicon_entry_free(*(lex_entry_t **)(*(long *)&entry->word_id + 0x10));
  }
  hash_table_free(lexicon->ht);
  ckd_free(lexicon);
  return;
}

Assistant:

void lexicon_free(lexicon_t *lexicon)
{
    hash_iter_t *itor;
    
    for (itor = hash_table_iter(lexicon->ht);
             itor; itor = hash_table_iter_next(itor)) {
        lex_entry_t *entry = hash_entry_val(itor->ent);
        lexicon_entry_free(entry);
    }
    hash_table_free(lexicon->ht);
    ckd_free(lexicon);
}